

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::
getTessellationEvaluationShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,
          bool should_pass_pointsize_data,_tessellation_primitive_mode primitive_mode,
          _tessellation_shader_vertex_ordering vertex_ordering,
          _tessellation_shader_vertex_spacing vertex_spacing,bool is_point_mode_enabled)

{
  ostream *poVar1;
  ulong uVar2;
  _tessellation_primitive_mode primitive_mode_00;
  _tessellation_shader_vertex_spacing extraout_EDX;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  _tessellation_shader_vertex_spacing extraout_EDX_00;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  _tessellation_shader_vertex_spacing vertex_spacing_01;
  char *pcVar3;
  string local_3c0;
  string vertex_spacing_mode_string;
  string vertex_ordering_string;
  string primitive_mode_string;
  stringstream helper_sstream;
  ostream local_330;
  stringstream result_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator<<(&local_1a8,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n");
  if (should_pass_pointsize_data) {
    std::operator<<(&local_1a8,"${TESSELLATION_POINT_SIZE_REQUIRE}\n");
  }
  std::operator<<(&local_1a8,
                  "\nlayout (TESSELLATOR_PRIMITIVE_MODE VERTEX_SPACING_MODE VERTEX_ORDERING POINT_MODE) in;\n\n"
                 );
  if (should_pass_pointsize_data) {
    std::operator<<(&local_1a8,"${IN_PER_VERTEX_DECL_POINT_SIZE}");
    pcVar3 = "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
  }
  else {
    std::operator<<(&local_1a8,"${IN_PER_VERTEX_DECL}");
    pcVar3 = "${OUT_PER_VERTEX_DECL}";
  }
  std::operator<<(&local_1a8,pcVar3);
  std::operator<<(&local_1a8,"in OUT_TC\n{\n     vec2 value1;\n    ivec4 value2;\n} tc_data[];\n\n")
  ;
  if (should_pass_pointsize_data) {
    std::operator<<(&local_1a8,"out      float te_pointsize;\n");
  }
  std::operator<<(&local_1a8,
                  "out       vec4 te_position;\nout       vec2 te_value1;\nout flat ivec4 te_value2;\n\nvoid main()\n{\n"
                 );
  if (should_pass_pointsize_data) {
    std::operator<<(&local_1a8,"    te_pointsize = 0.0;\n");
  }
  poVar1 = std::operator<<(&local_1a8,
                           "    te_position  = vec4 (0.0);\n    te_value1    = vec2 (0.0);\n    te_value2    = ivec4(0);\n\n    for (int n = 0; n < "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_gl_max_patch_vertices_value);
  std::operator<<(poVar1,"; ++n)\n    {\n");
  if (should_pass_pointsize_data) {
    std::operator<<(&local_1a8,"        te_pointsize += gl_in[n].gl_PointSize;\n");
  }
  std::operator<<(&local_1a8,
                  "        te_position += gl_in  [n].gl_Position;\n        te_value1   += tc_data[n].value1;\n        te_value2   += tc_data[n].value2;\n    }\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&helper_sstream);
  std::__cxx11::string::~string((string *)&helper_sstream);
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            (&primitive_mode_string,(TessellationShaderUtils *)(ulong)primitive_mode,
             primitive_mode_00);
  vertex_ordering_string._M_dataplus._M_p = (pointer)&vertex_ordering_string.field_2;
  vertex_ordering_string._M_string_length = 0;
  vertex_spacing_mode_string._M_dataplus._M_p = (pointer)&vertex_spacing_mode_string.field_2;
  vertex_spacing_mode_string._M_string_length = 0;
  vertex_ordering_string.field_2._M_local_buf[0] = '\0';
  vertex_spacing_mode_string.field_2._M_local_buf[0] = '\0';
  if (vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) {
    TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
              ((string *)&helper_sstream,(TessellationShaderUtils *)0x2,
               TESSELLATION_SHADER_VERTEX_ORDERING_CCW);
    std::__cxx11::string::operator=((string *)&vertex_ordering_string,(string *)&helper_sstream);
    std::__cxx11::string::~string((string *)&helper_sstream);
    vertex_spacing_00 = extraout_EDX;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&helper_sstream);
    poVar1 = std::operator<<(&local_330,", ");
    TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
              (&local_3c0,(TessellationShaderUtils *)(ulong)vertex_ordering,vertex_ordering_00);
    std::operator<<(poVar1,(string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&vertex_ordering_string,(string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&helper_sstream);
    vertex_spacing_00 = extraout_EDX_00;
  }
  if (vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT) {
    TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
              ((string *)&helper_sstream,(TessellationShaderUtils *)0x3,vertex_spacing_00);
    std::__cxx11::string::operator=((string *)&vertex_spacing_mode_string,(string *)&helper_sstream)
    ;
    std::__cxx11::string::~string((string *)&helper_sstream);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&helper_sstream);
    poVar1 = std::operator<<(&local_330,", ");
    TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
              (&local_3c0,(TessellationShaderUtils *)(ulong)vertex_spacing,vertex_spacing_01);
    std::operator<<(poVar1,(string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&vertex_spacing_mode_string,(string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&helper_sstream);
  }
  while (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x178078e),
        uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(string *)0x1a);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x178078e);
  }
  while (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x17807a9),
        uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(string *)0xf);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x17807a9);
  }
  while (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x177f4ac),
        uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(string *)0x13);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x177f4ac);
  }
  while (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x189173d),
        uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(char *)0xa);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x189173d);
  }
  std::__cxx11::string::~string((string *)&vertex_spacing_mode_string);
  std::__cxx11::string::~string((string *)&vertex_ordering_string);
  std::__cxx11::string::~string((string *)&primitive_mode_string);
  std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getTessellationEvaluationShaderCode(
	bool should_pass_pointsize_data, _tessellation_primitive_mode primitive_mode,
	_tessellation_shader_vertex_ordering vertex_ordering, _tessellation_shader_vertex_spacing vertex_spacing,
	bool is_point_mode_enabled)
{
	std::stringstream result_sstream;
	std::string		  result;

	result_sstream << "${VERSION}\n"
					  "\n"
					  "${TESSELLATION_SHADER_REQUIRE}\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
	}

	result_sstream << "\n"
					  "layout (TESSELLATOR_PRIMITIVE_MODE VERTEX_SPACING_MODE VERTEX_ORDERING POINT_MODE) in;\n"
					  "\n";
	if (should_pass_pointsize_data)
	{
		result_sstream << "${IN_PER_VERTEX_DECL_POINT_SIZE}";
		result_sstream << "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
	}
	else
	{
		result_sstream << "${IN_PER_VERTEX_DECL}";
		result_sstream << "${OUT_PER_VERTEX_DECL}";
	}
	result_sstream << "in OUT_TC\n"
					  "{\n"
					  "     vec2 value1;\n"
					  "    ivec4 value2;\n"
					  "} tc_data[];\n"
					  "\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "out      float te_pointsize;\n";
	}

	result_sstream << "out       vec4 te_position;\n"
					  "out       vec2 te_value1;\n"
					  "out flat ivec4 te_value2;\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "    te_pointsize = 0.0;\n";
	}

	result_sstream << "    te_position  = vec4 (0.0);\n"
					  "    te_value1    = vec2 (0.0);\n"
					  "    te_value2    = ivec4(0);\n"
					  "\n"
					  "    for (int n = 0; n < "
				   << m_gl_max_patch_vertices_value << "; ++n)\n"
													   "    {\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "        te_pointsize += gl_in[n].gl_PointSize;\n";
	}

	result_sstream << "        te_position += gl_in  [n].gl_Position;\n"
					  "        te_value1   += tc_data[n].value1;\n"
					  "        te_value2   += tc_data[n].value2;\n"
					  "    }\n"
					  "}\n";

	result = result_sstream.str();

	/* Replace the tokens */
	const char* point_mode_token		   = "POINT_MODE";
	std::size_t point_mode_token_index	 = std::string::npos;
	std::string primitive_mode_string	  = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	const char* primitive_mode_token	   = "TESSELLATOR_PRIMITIVE_MODE";
	std::size_t primitive_mode_token_index = std::string::npos;
	std::string vertex_ordering_string;
	const char* vertex_ordering_token		= "VERTEX_ORDERING";
	std::size_t vertex_ordering_token_index = std::string::npos;
	std::string vertex_spacing_mode_string;
	const char* vertex_spacing_token	   = "VERTEX_SPACING_MODE";
	std::size_t vertex_spacing_token_index = std::string::npos;

	/* Prepare the vertex ordering token. We need to do this manually, because the default vertex spacing
	 * mode translates to empty string and the shader would fail to compile if we hadn't taken care of the
	 * comma
	 */
	if (vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT)
	{
		vertex_ordering_string = TessellationShaderUtils::getESTokenForVertexOrderingMode(vertex_ordering);
	}
	else
	{
		std::stringstream helper_sstream;

		helper_sstream << ", " << TessellationShaderUtils::getESTokenForVertexOrderingMode(vertex_ordering);

		vertex_ordering_string = helper_sstream.str();
	}

	/* Do the same for vertex spacing token */
	if (vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT)
	{
		vertex_spacing_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing);
	}
	else
	{
		std::stringstream helper_sstream;

		helper_sstream << ", " << TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing);

		vertex_spacing_mode_string = helper_sstream.str();
	}

	/* Primitive mode */
	while ((primitive_mode_token_index = result.find(primitive_mode_token)) != std::string::npos)
	{
		result = result.replace(primitive_mode_token_index, strlen(primitive_mode_token), primitive_mode_string);

		primitive_mode_token_index = result.find(primitive_mode_token);
	}

	/* Vertex ordering */
	while ((vertex_ordering_token_index = result.find(vertex_ordering_token)) != std::string::npos)
	{
		result = result.replace(vertex_ordering_token_index, strlen(vertex_ordering_token), vertex_ordering_string);

		vertex_ordering_token_index = result.find(vertex_ordering_token);
	}

	/* Vertex spacing */
	while ((vertex_spacing_token_index = result.find(vertex_spacing_token)) != std::string::npos)
	{
		result = result.replace(vertex_spacing_token_index, strlen(vertex_spacing_token), vertex_spacing_mode_string);

		vertex_spacing_token_index = result.find(vertex_spacing_token);
	}

	/* Point mode */
	while ((point_mode_token_index = result.find(point_mode_token)) != std::string::npos)
	{
		result = result.replace(point_mode_token_index, strlen(point_mode_token),
								(is_point_mode_enabled) ? ", point_mode" : "");

		point_mode_token_index = result.find(point_mode_token);
	}

	return result;
}